

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O1

base_learner * ExpReplay::expreplay_setup<(char)98,simple_label>(options_i *options,vw *all)

{
  size_t count;
  options_i *options_00;
  long lVar1;
  _func_int **pp_Var2;
  int iVar3;
  expreplay *dat;
  _func_int ***__dest;
  option_group_definition *this;
  typed_option<unsigned_long> *op;
  long *__dest_00;
  example *peVar4;
  bool *pbVar5;
  ostream *poVar6;
  base_learner *l;
  single_learner *base;
  learner<ExpReplay::expreplay,_example> *plVar7;
  string replay_string;
  string replay_count_string;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_1;
  undefined4 *local_2a0;
  long local_298;
  undefined4 local_290;
  undefined3 uStack_28c;
  undefined1 local_289;
  _func_int ***local_280;
  _func_int **local_278;
  _func_int **local_270 [2];
  undefined1 *local_260;
  long local_258;
  undefined1 local_250 [16];
  size_t *local_240;
  options_i *local_238;
  long local_230;
  string local_228;
  _func_int ***local_208;
  _func_int **local_200;
  _func_int **local_1f8 [2];
  string local_1e8;
  option_group_definition local_1c8;
  long *local_190;
  long local_188;
  long local_180 [2];
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<unsigned_long> local_d0;
  
  local_2a0 = &local_290;
  local_290 = 0x6c706572;
  uStack_28c = 0x5f7961;
  local_298 = 7;
  local_289 = 0;
  std::__cxx11::string::push_back((char)&local_2a0);
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,local_2a0,local_298 + (long)local_2a0);
  std::__cxx11::string::append((char *)&local_260);
  dat = calloc_or_throw<ExpReplay::expreplay>(1);
  dat->replay_count = 0;
  dat->base = (single_learner *)0x0;
  dat->buf = (example *)0x0;
  dat->filled = (bool *)0x0;
  dat->all = (vw *)0x0;
  dat->N = 0;
  local_170._0_8_ = (_func_int **)0x11;
  local_280 = local_270;
  local_280 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)local_170);
  local_270[0] = (_func_int **)local_170._0_8_;
  *(undefined4 *)local_280 = 0x65707845;
  builtin_strncpy((char *)((long)local_280 + 4),"rien",4);
  *(undefined4 *)(local_280 + 1) = 0x52206563;
  builtin_strncpy((char *)((long)local_280 + 0xc),"epla",4);
  *(char *)(local_280 + 2) = 'y';
  local_278 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_280 + local_170._0_8_) = '\0';
  local_1c8.m_name._M_dataplus._M_p = (pointer)&local_1c8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_280,(char *)(local_170._0_8_ + (long)local_280));
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_280 != local_270) {
    operator_delete(local_280);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_2a0,local_298 + (long)local_2a0);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_170,&local_1e8,&dat->N);
  local_100 = true;
  local_208 = local_1f8;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x83;
  local_238 = options;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_d0);
  pp_Var2 = local_d0.super_base_option._vptr_base_option;
  local_1f8[0] = local_d0.super_base_option._vptr_base_option;
  local_208 = __dest;
  memcpy(__dest,
         "use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost sensitive] with specified buffer size"
         ,0x83);
  local_200 = pp_Var2;
  *(undefined1 *)((long)__dest + (long)pp_Var2) = 0;
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                   (&local_1c8,(typed_option<unsigned_long> *)local_170);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_228,local_260,local_260 + local_258);
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,&local_228,&dat->replay_count);
  op = VW::config::typed_option<unsigned_long>::default_value(&local_d0,1);
  local_230 = 0x56;
  local_240 = &dat->replay_count;
  local_190 = local_180;
  __dest_00 = (long *)std::__cxx11::string::_M_create((ulong *)&local_190,(ulong)&local_230);
  lVar1 = local_230;
  local_180[0] = local_230;
  local_190 = __dest_00;
  memcpy(__dest_00,
         "how many times (in expectation) should each example be played (default: 1 = permuting)",
         0x56);
  local_188 = lVar1;
  *(undefined1 *)((long)__dest_00 + lVar1) = 0;
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>(this,op);
  options_00 = local_238;
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d5088;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208);
  }
  local_170._0_8_ = &PTR__typed_option_002d5088;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_1c8);
  iVar3 = (*options_00->_vptr_options_i[1])(options_00,&local_2a0);
  if (((char)iVar3 == '\0') || (count = dat->N, count == 0)) {
    plVar7 = (learner<ExpReplay::expreplay,_example> *)0x0;
  }
  else {
    dat->all = all;
    peVar4 = VW::alloc_examples(1,count);
    dat->buf = peVar4;
    pbVar5 = calloc_or_throw<bool>(dat->N);
    dat->filled = pbVar5;
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"experience replay level=",0x18);
      local_170[0] = 0x62;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_170,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", buffer=",9);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", replay count=",0xf);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    l = setup_base(options_00,all);
    base = LEARNER::as_singleline<char,char>(l);
    dat->base = base;
    plVar7 = LEARNER::learner<ExpReplay::expreplay,example>::
             init_learner<LEARNER::learner<char,example>>
                       (dat,base,predict_or_learn<true,simple_label>,
                        predict_or_learn<false,simple_label>,1,*(prediction_type_t *)(base + 0xd0));
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = finish<simple_label>;
    *(undefined8 *)(plVar7 + 0x88) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0x90) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 0x98) = end_pass;
    dat = (expreplay *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_name._M_dataplus._M_p != &local_1c8.m_name.field_2) {
    operator_delete(local_1c8.m_name._M_dataplus._M_p);
  }
  if (dat != (expreplay *)0x0) {
    free(dat);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  return (base_learner *)plVar7;
}

Assistant:

LEARNER::base_learner* expreplay_setup(VW::config::options_i& options, vw& all)
{
  std::string replay_string = "replay_";
  replay_string += er_level;
  std::string replay_count_string = replay_string;
  replay_count_string += "_count";

  auto er = scoped_calloc_or_throw<expreplay>();
  VW::config::option_group_definition new_options("Experience Replay");
  new_options
      .add(VW::config::make_option(replay_string, er->N)
               .keep()
               .help("use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost "
                     "sensitive] with specified buffer size"))
      .add(VW::config::make_option(replay_count_string, er->replay_count)
               .default_value(1)
               .help("how many times (in expectation) should each example be played (default: 1 = permuting)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied(replay_string) || er->N == 0)
    return nullptr;

  er->all = &all;
  er->buf = VW::alloc_examples(1, er->N);

  if (er_level == 'c')
    for (size_t n = 0; n < er->N; n++) er->buf[n].l.cs.costs = v_init<COST_SENSITIVE::wclass>();

  er->filled = calloc_or_throw<bool>(er->N);

  if (!all.quiet)
    std::cerr << "experience replay level=" << er_level << ", buffer=" << er->N << ", replay count=" << er->replay_count
              << std::endl;

  er->base = LEARNER::as_singleline(setup_base(options, all));
  LEARNER::learner<expreplay, example>* l =
      &init_learner(er, er->base, predict_or_learn<true, lp>, predict_or_learn<false, lp>);
  l->set_finish(finish<lp>);
  l->set_end_pass(end_pass);

  return make_base(*l);
}